

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redexpress.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  string *psVar2;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  MidiFile midifile;
  Options options;
  
  smf::Options::Options(&options);
  checkOptions(&options,argc,argv);
  smf::MidiFile::MidiFile(&midifile);
  iVar1 = smf::Options::getArgCount(&options);
  if (iVar1 < 1) {
    smf::MidiFile::read(&midifile,0x1382b8,__buf,in_RCX);
  }
  else {
    psVar2 = smf::Options::getArg_abi_cxx11_(&options,1);
    smf::MidiFile::read(&midifile,(int)psVar2,__buf_00,in_RCX);
  }
  addExpression_T100(&midifile);
  iVar1 = smf::Options::getArgCount(&options);
  if (iVar1 < 2) {
    operator<<((ostream *)&std::cout,&midifile);
  }
  else {
    psVar2 = smf::Options::getArg_abi_cxx11_(&options,2);
    smf::MidiFile::write(&midifile,(int)psVar2,__buf_01,in_RCX);
  }
  smf::MidiFile::~MidiFile(&midifile);
  smf::Options::~Options(&options);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	Options options;
	checkOptions(options, argc, argv);
	MidiFile midifile;
	if (options.getArgCount() > 0) {
		midifile.read(options.getArg(1));
	} else {
		midifile.read(cin);
	}
	addExpression_T100(midifile);
	if (options.getArgCount() >= 2) {
		midifile.write(options.getArg(2));
	} else {
		cout << midifile;
	}

	return 0;
}